

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

char * subclassname(Fl_Type *l)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar3 = (*l->_vptr_Fl_Type[0x17])();
  if (iVar3 == 0) goto LAB_00182999;
  pcVar4 = l[1].user_data_;
  if (pcVar4 == (char *)0x0) {
    iVar3 = (*l->_vptr_Fl_Type[0x26])(l);
    if (iVar3 != 0) {
      pcVar4 = "Fl_Group";
      goto LAB_00182993;
    }
    if ((char)(l[1].prev)->header_position == -0xf) {
      pcVar4 = "Fl_Double_Window";
      goto LAB_00182993;
    }
    iVar3 = (*l->_vptr_Fl_Type[5])(l);
    iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"Fl_Input");
    pcVar4 = (char *)CONCAT44(extraout_var_01,iVar3);
    if (iVar3 == 0) {
      bVar1 = (byte)(l[1].prev)->header_position;
      pcVar4 = (char *)(ulong)bVar1;
      if (bVar1 != 1) {
        if (bVar1 == 2) {
          pcVar4 = "Fl_Int_Input";
          goto LAB_00182993;
        }
        goto LAB_001829c1;
      }
      bVar2 = false;
      pcVar4 = "Fl_Float_Input";
    }
    else {
LAB_001829c1:
      bVar2 = true;
    }
  }
  else {
LAB_00182993:
    bVar2 = false;
  }
  if (!bVar2) {
    return pcVar4;
  }
LAB_00182999:
  iVar3 = (*l->_vptr_Fl_Type[5])(l);
  return (char *)CONCAT44(extraout_var,iVar3);
}

Assistant:

const char* subclassname(Fl_Type* l) {
  if (l->is_widget()) {
    Fl_Widget_Type* p = (Fl_Widget_Type*)l;
    const char* c = p->subclass();
    if (c) return c;
    if (l->is_class()) return "Fl_Group";
    if (p->o->type() == FL_WINDOW+1) return "Fl_Double_Window";
    if (strcmp(p->type_name(), "Fl_Input") == 0) {
      if (p->o->type() == FL_FLOAT_INPUT) return "Fl_Float_Input";
      if (p->o->type() == FL_INT_INPUT) return "Fl_Int_Input";
    }
  }
  return l->type_name();
}